

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sDrawTests.cpp
# Opt level: O0

int __thiscall deqp::gles2::Stress::DrawTests::init(DrawTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int extraout_EAX;
  TestNode *node;
  MethodGroup *this_00;
  char *name_00;
  char *descr;
  TestNode *node_00;
  DrawMethod method;
  undefined8 extraout_RDX;
  undefined8 uVar1;
  undefined8 extraout_RDX_00;
  undefined1 local_70 [8];
  string desc;
  string name;
  DrawMethod local_28;
  int ndx;
  DrawMethod basicMethods [1];
  TestCaseGroup *unalignedGroup;
  DrawTests *this_local;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "unaligned_data","Test with unaligned data");
  tcu::TestNode::addChild((TestNode *)this,node);
  local_28 = DRAWMETHOD_DRAWELEMENTS;
  uVar1 = extraout_RDX;
  for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 1;
      name.field_2._12_4_ = name.field_2._12_4_ + 1) {
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              ((string *)((long)&desc.field_2 + 8),
               (DrawTestSpec *)(ulong)(&local_28)[(int)name.field_2._12_4_],(DrawMethod)uVar1);
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              ((string *)local_70,(DrawTestSpec *)(ulong)(&local_28)[(int)name.field_2._12_4_],
               method);
    this_00 = (MethodGroup *)operator_new(0x80);
    context = (this->super_TestCaseGroup).m_context;
    name_00 = (char *)std::__cxx11::string::c_str();
    descr = (char *)std::__cxx11::string::c_str();
    anon_unknown_0::MethodGroup::MethodGroup
              (this_00,context,name_00,descr,(&local_28)[(int)name.field_2._12_4_]);
    tcu::TestNode::addChild(node,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
    uVar1 = extraout_RDX_00;
  }
  node_00 = (TestNode *)operator_new(0x78);
  anon_unknown_0::RandomGroup::RandomGroup
            ((RandomGroup *)node_00,(this->super_TestCaseGroup).m_context,"random",
             "random draw commands.");
  tcu::TestNode::addChild(node,node_00);
  return extraout_EAX;
}

Assistant:

void DrawTests::init (void)
{
	tcu::TestCaseGroup* const unalignedGroup	= new tcu::TestCaseGroup(m_testCtx, "unaligned_data", "Test with unaligned data");

	addChild(unalignedGroup);

	// .unaligned_data
	{
		const gls::DrawTestSpec::DrawMethod basicMethods[] =
		{
			// gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS,
			gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS,
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(basicMethods); ++ndx)
		{
			std::string name = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);
			std::string desc = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);

			unalignedGroup->addChild(new MethodGroup(m_context, name.c_str(), desc.c_str(), basicMethods[ndx]));
		}

		// Random

		unalignedGroup->addChild(new RandomGroup(m_context, "random", "random draw commands."));
	}

}